

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  Curl_easy *pCVar3;
  byte bVar4;
  int iVar5;
  Curl_hash *pCVar6;
  void *pvVar7;
  ulong uVar8;
  size_t key_len;
  ulong uVar9;
  ulong uVar10;
  Curl_easy **key;
  uint uVar11;
  int iVar12;
  byte bVar13;
  long lVar14;
  bool bVar15;
  uchar actions [5];
  curl_socket_t socks [5];
  int local_78;
  uint local_74;
  Curl_easy *local_70;
  Curl_hash *local_68;
  int local_5c;
  byte local_55 [5];
  Curl_multi *local_50;
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_70 = data;
  local_50 = multi;
  local_74 = multi_getsock(data,local_48);
  local_68 = &multi->sockhash;
  uVar9 = 0;
  do {
    bVar13 = (byte)uVar9;
    uVar11 = 0x10000 << (bVar13 & 0x1f);
    if ((local_74 >> (bVar13 & 0x1f) & 0x10001) == 0) goto LAB_001323d9;
    iVar2 = local_48[uVar9];
    local_78 = iVar2;
    if (iVar2 == -1) {
      pCVar6 = (Curl_hash *)0x0;
    }
    else {
      pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,&local_78,4);
    }
    bVar15 = (1 << (bVar13 & 0x1f) & local_74) != 0;
    bVar13 = bVar15 + 2;
    if ((uVar11 & local_74) == 0) {
      bVar13 = bVar15;
    }
    local_55[uVar9] = bVar13;
    if (pCVar6 == (Curl_hash *)0x0) {
      local_5c = iVar2;
      if (iVar2 == -1) {
        pCVar6 = (Curl_hash *)0x0;
        local_78 = iVar2;
      }
      else {
        local_78 = iVar2;
        pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,&local_78,4);
      }
      if (pCVar6 == (Curl_hash *)0x0) {
        pCVar6 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (pCVar6 != (Curl_hash *)0x0) {
          iVar5 = Curl_hash_init(pCVar6,0xd,trhash,trhash_compare,trhash_dtor);
          if (iVar5 == 0) {
            pvVar7 = Curl_hash_add(local_68,&local_5c,4,pCVar6);
            if (pvVar7 != (void *)0x0) goto LAB_001322bb;
            Curl_hash_destroy(pCVar6);
          }
          (*Curl_cfree)(pCVar6);
        }
        pCVar6 = (Curl_hash *)0x0;
      }
LAB_001322bb:
      bVar4 = 0;
      bVar15 = false;
      if (pCVar6 != (Curl_hash *)0x0) goto LAB_001322c7;
LAB_0013230e:
      iVar5 = 1;
    }
    else {
      uVar8 = (ulong)local_70->numsocks;
      bVar4 = 0;
      bVar15 = 0 < (long)uVar8;
      if (0 < (long)uVar8) {
        uVar10 = 0;
        do {
          if (iVar2 == local_70->sockets[uVar10]) {
            bVar4 = local_70->actions[uVar10];
            bVar15 = true;
            goto LAB_001322c7;
          }
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        bVar15 = uVar10 < uVar8;
      }
LAB_001322c7:
      if (bVar15) {
        if (bVar4 == bVar13) {
          if (!bVar15) goto LAB_001322d9;
        }
        else {
          if ((bVar4 & 1) != 0) {
            *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + -1;
          }
          if ((bVar4 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
            *piVar1 = *piVar1 + -1;
          }
          if ((bVar13 & 1) != 0) {
            *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
          }
          if ((local_74 & uVar11) != 0) {
            piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
            *piVar1 = *piVar1 + 1;
          }
        }
      }
      else {
LAB_001322d9:
        piVar1 = (int *)((long)&pCVar6[1].table + 4);
        *piVar1 = *piVar1 + 1;
        if ((bVar13 & 1) != 0) {
          *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
        }
        if ((local_74 & uVar11) != 0) {
          piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
          *piVar1 = *piVar1 + 1;
        }
        pvVar7 = Curl_hash_add(pCVar6,&local_70,8,local_70);
        if (pvVar7 == (void *)0x0) goto LAB_0013230e;
      }
      iVar12 = (uint)(*(int *)&pCVar6[1].comp_func != 0) +
               (uint)(*(int *)((long)&pCVar6[1].comp_func + 4) != 0) * 2;
      if ((!bVar15) || (iVar5 = 7, *(int *)&pCVar6[1].table != iVar12)) {
        if (local_50->socket_cb != (curl_socket_callback)0x0) {
          (*local_50->socket_cb)(local_70,iVar2,iVar12,local_50->socket_userp,pCVar6[1].hash_func);
        }
        *(int *)&pCVar6[1].table = iVar12;
        iVar5 = 0;
      }
    }
    if ((iVar5 != 7) && (iVar5 != 0)) {
      return CURLM_OUT_OF_MEMORY;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 5);
  uVar9 = 5;
LAB_001323d9:
  uVar8 = uVar9 & 0xffffffff;
  if (0 < local_70->numsocks) {
    lVar14 = 0;
    do {
      iVar2 = local_70->sockets[lVar14];
      if ((int)uVar9 != 0) {
        uVar10 = 0;
        do {
          if (iVar2 == local_48[uVar10]) goto LAB_001324b5;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      local_78 = iVar2;
      if (iVar2 == -1) {
        pCVar6 = (Curl_hash *)0x0;
      }
      else {
        pCVar6 = (Curl_hash *)Curl_hash_pick(local_68,&local_78,4);
      }
      if (pCVar6 != (Curl_hash *)0x0) {
        bVar13 = local_70->actions[lVar14];
        iVar5 = *(int *)((long)&pCVar6[1].table + 4) + -1;
        *(int *)((long)&pCVar6[1].table + 4) = iVar5;
        if ((bVar13 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar13 & 1) != 0) {
          *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + -1;
        }
        if (iVar5 == 0) {
          if (local_50->socket_cb != (curl_socket_callback)0x0) {
            (*local_50->socket_cb)(local_70,iVar2,4,local_50->socket_userp,pCVar6[1].hash_func);
          }
          local_78 = iVar2;
          Curl_hash_destroy(pCVar6);
          key_len = 4;
          key = (Curl_easy **)&local_78;
          pCVar6 = local_68;
        }
        else {
          key_len = 8;
          key = &local_70;
        }
        Curl_hash_delete(pCVar6,key,key_len);
      }
LAB_001324b5:
      lVar14 = lVar14 + 1;
    } while (lVar14 < local_70->numsocks);
  }
  pCVar3 = local_70;
  memcpy(local_70->sockets,local_48,uVar8 * 4);
  memcpy(pCVar3->actions,local_55,uVar8);
  pCVar3->numsocks = (int)uVar9;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  unsigned char actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned char action = CURL_POLL_NONE;
    unsigned char prevaction = 0;
    int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(char));
  data->numsocks = num;
  return CURLM_OK;
}